

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void string_suite::test_escape_unicode_CDEF(void)

{
  undefined4 local_190;
  value local_18c [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined4 local_154;
  value local_150 [2];
  undefined1 local_148 [8];
  decoder_type decoder;
  char input [9];
  
  decoder.current.scan.string.segment_tail[0x1f] = (const_pointer)0x2246454443755c22;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<9ul>
            ((basic_decoder<char> *)local_148,
             (value_type (*) [9])((long)&decoder.current.scan + 0x100));
  local_150[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_148);
  local_154 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x698,"void string_suite::test_escape_unicode_CDEF()",local_150,&local_154);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_178,(basic_decoder<char> *)local_148);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("decoder.string_value<std::string>()","\"\\uCDEF\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x699,"void string_suite::test_escape_unicode_CDEF()",&local_178,anon_var_dwarf_69b2);
  std::__cxx11::string::~string((string *)&local_178);
  trial::protocol::json::detail::basic_decoder<char>::next((basic_decoder<char> *)local_148);
  local_18c[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_148);
  local_190 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x69b,"void string_suite::test_escape_unicode_CDEF()",local_18c,&local_190);
  return;
}

Assistant:

void test_escape_unicode_CDEF()
{
    const char input[] = "\"\\uCDEF\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "\uCDEF");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}